

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O1

void __thiscall QToolBarLayout::setGeometry(QToolBarLayout *this,QRect *rect)

{
  Representation RVar1;
  int iVar2;
  ulong uVar3;
  QRect *pQVar4;
  QRect QVar5;
  bool bVar6;
  int iVar7;
  Orientation OVar8;
  ToolBarArea TVar9;
  int iVar10;
  LayoutDirection direction;
  QWidget *pQVar11;
  QStyle *pQVar12;
  QMainWindow *this_00;
  ulong uVar13;
  int iVar14;
  Representation RVar15;
  Representation RVar16;
  Representation RVar17;
  int iVar18;
  Representation RVar19;
  int iVar20;
  long in_FS_OFFSET;
  QMargins QVar21;
  QStyleOptionToolBar opt;
  QRect local_a8;
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QPalettePrivate *pQStack_70;
  undefined1 *local_68;
  QObject *pQStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QLayout::parentWidget(&this->super_QLayout);
  pQVar11 = (QWidget *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
  if (pQVar11 != (QWidget *)0x0) {
    pQVar12 = QWidget::style(pQVar11);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionToolBar::QStyleOptionToolBar((QStyleOptionToolBar *)local_98);
    (**(code **)(*(long *)pQVar11 + 0x1a0))(pQVar11,(QStyleOptionToolBar *)local_98);
    QVar21 = QLayout::contentsMargins(&this->super_QLayout);
    iVar7 = (**(code **)(*(long *)pQVar12 + 0xe0))
                      (pQVar12,0x39,(QStyleOptionToolBar *)local_98,pQVar11);
    OVar8 = QToolBar::orientation((QToolBar *)pQVar11);
    QLayout::setGeometry(&this->super_QLayout,rect);
    QVar5 = local_a8;
    if ((this->super_QLayout).super_QLayoutItem.field_0xd == '\0') {
      local_a8.y1.m_i = ((rect->y2).m_i - (rect->y1).m_i) + 1;
      local_a8.x1.m_i = ((rect->x2).m_i - (rect->x1).m_i) + 1;
      local_a8._8_8_ = QVar5._8_8_;
      bVar6 = layoutActions(this,(QSize *)&local_a8);
    }
    else {
      bVar6 = false;
    }
    if ((((this->super_QLayout).super_QLayoutItem.field_0xc == '\0') && (bVar6 == false)) &&
       (((this->super_QLayout).super_QLayoutItem.field_0xd & 1) == 0)) {
      if ((((this->extension->super_QToolButton).super_QAbstractButton.super_QWidget.data)->
           widget_attributes & 0x10000) == 0) {
        QWidget::hide((QWidget *)this->extension);
      }
    }
    else {
      this_00 = (QMainWindow *)QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
      if (this_00 == (QMainWindow *)0x0) {
        TVar9 = TopToolBarArea;
      }
      else {
        TVar9 = QMainWindow::toolBarArea(this_00,(QToolBar *)pQVar11);
      }
      uVar13 = (**(code **)(*(long *)&this->super_QLayout + 0xf0))(this);
      iVar10 = (rect->x2).m_i;
      iVar18 = (rect->y2).m_i;
      RVar17 = QVar21.m_bottom.m_i;
      iVar14 = iVar18;
      if (OVar8 == Horizontal) {
        iVar14 = iVar10;
      }
      RVar15 = QVar21.m_right.m_i;
      RVar16.m_i = RVar15.m_i;
      if (OVar8 == Horizontal) {
        RVar16.m_i = RVar17.m_i;
      }
      iVar14 = (iVar14 - (RVar16.m_i + iVar7)) + 2;
      local_a8.x1.m_i = 0;
      if (OVar8 == Horizontal) {
        local_a8.x1.m_i = iVar14;
      }
      RVar19 = QVar21.m_top.m_i;
      RVar16 = QVar21.m_left.m_i;
      if ((TVar9 == TopToolBarArea) || (TVar9 == LeftToolBarArea)) {
        RVar1.m_i = RVar19.m_i;
        pQVar4 = rect;
        if (OVar8 != Vertical) {
          RVar1.m_i = RVar16.m_i;
          pQVar4 = (QRect *)&rect->y1;
        }
        iVar18 = RVar1.m_i + (pQVar4->x1).m_i;
        local_a8.y1.m_i = iVar18;
        if (OVar8 == Vertical) {
          local_a8.y1.m_i = iVar14;
          local_a8.x1.m_i = iVar18;
        }
      }
      else {
        RVar1.m_i = RVar15.m_i;
        if (OVar8 == Vertical) {
          RVar1.m_i = RVar17.m_i;
        }
        iVar20 = (int)(uVar13 >> 0x20);
        iVar2 = RVar19.m_i + RVar17.m_i;
        if (OVar8 == Vertical) {
          iVar20 = (int)uVar13;
          iVar2 = RVar15.m_i + RVar16.m_i;
        }
        if (OVar8 == Vertical) {
          iVar18 = iVar10;
        }
        iVar18 = (iVar2 - (iVar20 + RVar1.m_i)) + 1 + iVar18;
        local_a8.y1.m_i = iVar18;
        if (OVar8 == Vertical) {
          local_a8.y1.m_i = iVar14;
          local_a8.x1.m_i = iVar18;
        }
      }
      uVar3 = uVar13 >> 0x20;
      if (OVar8 == Vertical) {
        uVar3 = uVar13;
      }
      iVar18 = RVar17.m_i + RVar19.m_i;
      if (OVar8 == Vertical) {
        iVar18 = RVar15.m_i + RVar16.m_i;
      }
      iVar18 = (int)uVar3 - iVar18;
      iVar10 = iVar18;
      if (OVar8 == Vertical) {
        iVar10 = iVar7;
      }
      iVar14 = -1;
      if (OVar8 == Horizontal) {
        iVar14 = iVar7;
      }
      if (OVar8 == Vertical) {
        iVar14 = iVar18;
      }
      local_a8.x2.m_i = iVar14 + -1 + local_a8.x1.m_i;
      local_a8.y2.m_i = iVar10 + local_a8.y1.m_i + -1;
      if (OVar8 == Horizontal) {
        pQVar11 = QLayout::parentWidget(&this->super_QLayout);
        direction = QWidget::layoutDirection(pQVar11);
        local_a8 = QStyle::visualRect(direction,rect,&local_a8);
      }
      QWidget::setGeometry((QWidget *)this->extension,&local_a8);
      if ((((this->extension->super_QToolButton).super_QAbstractButton.super_QWidget.data)->
           widget_attributes & 0x10000) != 0) {
        QWidget::show((QWidget *)this->extension);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolBarLayout::setGeometry(const QRect &rect)
{
    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return;
    QStyle *style = tb->style();
    QStyleOptionToolBar opt;
    tb->initStyleOption(&opt);
    const QMargins margins = contentsMargins();
    const int extensionExtent = style->pixelMetric(QStyle::PM_ToolBarExtensionExtent, &opt, tb);
    Qt::Orientation o = tb->orientation();

    QLayout::setGeometry(rect);

    updateMacBorderMetrics();

    bool ranOutOfSpace = false;
    if (!animating)
        ranOutOfSpace = layoutActions(rect.size());

    if (expanded || animating || ranOutOfSpace) {
        Qt::ToolBarArea area = Qt::TopToolBarArea;
        if (QMainWindow *win = qobject_cast<QMainWindow*>(tb->parentWidget()))
            area = win->toolBarArea(tb);
        QSize hint = sizeHint();

        QPoint pos;
        rpick(o, pos) = pick(o, rect.bottomRight()) -
                pick(o, QSize(margins.bottom(), margins.right())) - extensionExtent + 2;
        if (area == Qt::LeftToolBarArea || area == Qt::TopToolBarArea)
            rperp(o, pos) = perp(o, rect.topLeft()) +
                    perp(o, QSize(margins.top(), margins.left()));
        else
            rperp(o, pos) = perp(o, rect.bottomRight()) -
                    perp(o, QSize(margins.bottom(), margins.right())) -
                    (perp(o, hint) - perp(o, margins)) + 1;
        QSize size;
        rpick(o, size) = extensionExtent;
        rperp(o, size) = perp(o, hint) - perp(o, margins);
        QRect r(pos, size);

        if (o == Qt::Horizontal)
            r = QStyle::visualRect(parentWidget()->layoutDirection(), rect, r);

        extension->setGeometry(r);

        if (extension->isHidden())
            extension->show();
    } else {
        if (!extension->isHidden())
            extension->hide();
    }
}